

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_pairs(lua_State *L)

{
  int iVar1;
  lua_State *L_local;
  
  iVar1 = pairsmeta(L,"__pairs",0,luaB_next);
  return iVar1;
}

Assistant:

static int luaB_pairs (lua_State *L) {
  return pairsmeta(L, "__pairs", 0, luaB_next);
}